

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::HttpServer::listenLoop(HttpServer *this,ConnectionReceiver *port)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  Disposer *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  (**in_RDX->_vptr_Disposer)(&local_60);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_60,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:5066:13),_kj::_::PropagateException>
             ::anon_class_16_2_3fe4823c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042cb90;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)port;
  this_00[1].dependency.disposer = in_RDX;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<kj::AsyncIoStream>,kj::HttpServer::listenLoop(kj::ConnectionReceiver&)::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)this_00;
  _::maybeChain<void>(&local_40,(Promise<void> *)&intermediate);
  pPVar1 = local_40.ptr;
  local_30.disposer = local_40.disposer;
  local_40.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_40);
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_40.disposer;
  this->timer = (Timer *)pPVar1;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_60);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpServer::listenLoop(kj::ConnectionReceiver& port) {
  return port.accept()
      .then([this,&port](kj::Own<kj::AsyncIoStream>&& connection) -> kj::Promise<void> {
    if (draining) {
      // Can get here if we *just* started draining.
      return kj::READY_NOW;
    }

    tasks.add(listenHttp(kj::mv(connection)));
    return listenLoop(port);
  });
}